

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int32_t floatx80_to_int32_mipsel(floatx80 a,float_status *status)

{
  _Bool _Var1;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  uint64_t local_40;
  uint64_t aSig;
  int local_30;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_00);
  if (_Var1) {
    float_raise_mipsel('\x01',_aExp);
    a_local._12_4_ = 0x80000000;
  }
  else {
    a_01.high = (uint16_t)a_local.low;
    a_01.low = (uint64_t)status_local;
    a_01._10_6_ = 0;
    local_40 = extractFloatx80Frac(a_01);
    a_02.high = (uint16_t)a_local.low;
    a_02.low = (uint64_t)status_local;
    a_02._10_6_ = 0;
    local_30 = extractFloatx80Exp(a_02);
    a_03.high = (uint16_t)a_local.low;
    a_03.low = (uint64_t)status_local;
    a_03._10_6_ = 0;
    shiftCount._3_1_ = extractFloatx80Sign(a_03);
    if ((local_30 == 0x7fff) && ((local_40 & 0x7fffffffffffffff) != 0)) {
      shiftCount._3_1_ = '\0';
    }
    aSig._4_4_ = 0x4037 - local_30;
    if (aSig._4_4_ < 1) {
      aSig._4_4_ = 1;
    }
    shift64RightJamming(local_40,aSig._4_4_,&local_40);
    a_local._12_4_ = roundAndPackInt32(shiftCount._3_1_,local_40,_aExp);
  }
  return a_local._12_4_;
}

Assistant:

int32_t floatx80_to_int32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1 << 31;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) aSign = 0;
    shiftCount = 0x4037 - aExp;
    if ( shiftCount <= 0 ) shiftCount = 1;
    shift64RightJamming( aSig, shiftCount, &aSig );
    return roundAndPackInt32(aSign, aSig, status);

}